

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O2

void __thiscall host_array_data_Test::host_array_data_Test(host_array_data_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0014ae60;
  return;
}

Assistant:

CAMP_TEST_BEGIN(array, begin)
{
   camp::array<int, 2> a = {1, 8};
   auto a_it = a.begin();

   const camp::array<int, 2>& b{a};
   auto b_it = b.begin();

   bool passed = *a_it++ == 1 &&
                 *a_it++ == 8 &&
                 *b_it++ == 1 &&
                 *b_it++ == 8;

   a_it = a.begin();
   *a_it = 4;
   b_it = b.begin();

   return passed &&
          *a_it++ == 4 &&
          *a_it++ == 8 &&
          *b_it++ == 4 &&
          *b_it++ == 8;
}